

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O1

void pztopology::TPZLine::TShape<double>
               (TPZVec<double> *loc,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  
  dVar1 = *loc->fStore;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *phi->fElem = (1.0 - dVar1) * 0.5;
  if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  phi->fElem[1] = (dVar1 + 1.0) * 0.5;
  if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *dphi->fElem = -0.5;
  if ((0 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) &&
     (1 < (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow] = 0.5;
    return;
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

inline void TPZLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T x = loc[0];
        phi(0,0) = (1.0-x)/2.;
        phi(1,0) = (1.0+x)/2.;
        dphi(0,0) = -0.5;
        dphi(0,1) = 0.5;
    }